

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O0

uc_err dummy_uc_afl_fuzz_callback(uc_engine *uc,void *data)

{
  uc_err uVar1;
  uint64_t uVar2;
  uint64_t pc;
  void *data_local;
  uc_engine *uc_local;
  
  uVar2 = uc_get_pc(uc);
  uVar1 = uc_emu_start(uc,uVar2,0,0);
  return uVar1;
}

Assistant:

static uc_err dummy_uc_afl_fuzz_callback(uc_engine* uc, void* data) {
    uint64_t pc;

    pc = uc_get_pc(uc);

    // Note the multiple exits is enabled in this case.
    return uc_emu_start(uc, pc, 0, 0, 0);
}